

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O0

uint __thiscall ON_V4V5_MeshNgonList::V4V5_SizeOf(ON_V4V5_MeshNgonList *this)

{
  int local_1c;
  int local_18;
  int i;
  int icount;
  uint sz;
  ON_V4V5_MeshNgonList *this_local;
  
  local_18 = 0;
  for (local_1c = 0; local_1c < this->m_ngons_count; local_1c = local_1c + 1) {
    local_18 = this->m_ngons[local_1c].N * 2 + local_18;
  }
  return this->m_ngons_capacity * 0x18 + 0x18 + local_18 * 4;
}

Assistant:

unsigned int ON_V4V5_MeshNgonList::V4V5_SizeOf() const
{
  unsigned int sz = sizeof(*this);
  int icount = 0;
  for ( int i = 0; i < m_ngons_count; i++ )
  {
    icount += 2*m_ngons[i].N;
  }
  sz += m_ngons_capacity*sizeof(m_ngons[0]);
  sz += icount*sizeof(int);
  return sz;
}